

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O3

void la_miam_core_v2_data_format_text(la_vstring *vstr,void *data,int indent)

{
  byte bVar1;
  _Bool _Var2;
  ulong in_RAX;
  void *pvVar3;
  xmlBufferPtr pxVar4;
  char *pcVar5;
  _Bool prettify_xml;
  undefined8 uStack_28;
  
  if (*(ushort *)((long)data + 8) != 0) {
    la_miam_errors_format_text(vstr,(uint)*(ushort *)((long)data + 8),indent);
    return;
  }
  uStack_28 = in_RAX;
  la_vstring_append_sprintf
            (vstr,"%*sMsg num: %u\n",(ulong)(uint)indent,"",(ulong)*(byte *)((long)data + 0x1b));
  pcVar5 = "not ";
  if (*(char *)((long)data + 0x1c) == '\x01') {
    pcVar5 = "";
  }
  la_vstring_append_sprintf(vstr,"%*sACK: %srequired\n",(ulong)(uint)indent,"",pcVar5);
  pvVar3 = la_dict_search(la_miam_core_v2_data_format_text::v2_compression_names,
                          (uint)*(byte *)((long)data + 0x1d));
  if (pvVar3 == (void *)0x0) {
    la_vstring_append_sprintf
              (vstr,"%*sCompression: unknown (%u)\n",(ulong)(uint)indent,"",
               (ulong)*(byte *)((long)data + 0x1d));
  }
  else {
    la_vstring_append_sprintf(vstr,"%*sCompression: %s\n",(ulong)(uint)indent,"",pvVar3);
  }
  pvVar3 = la_dict_search(la_miam_core_v2_data_format_text::v2_encoding_names,
                          (uint)*(byte *)((long)data + 0x1e));
  if (pvVar3 == (void *)0x0) {
    la_vstring_append_sprintf
              (vstr,"%*sEncoding: unknown (%u)\n",(ulong)(uint)indent,"",
               (ulong)*(byte *)((long)data + 0x1e));
  }
  else {
    la_vstring_append_sprintf(vstr,"%*sEncoding: %s\n",(ulong)(uint)indent,"",pvVar3);
  }
  bVar1 = *(byte *)((long)data + 0x1f);
  if (bVar1 < 0xe) {
    if ((0x20f0U >> (bVar1 & 0x1f) & 1) == 0) {
      if ((7U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_00155221;
      la_vstring_append_sprintf(vstr,"%*sACARS:\n",(ulong)(uint)indent,"");
      indent = indent + 1;
      la_vstring_append_sprintf
                (vstr,"%*sLabel: %c%c",(ulong)(uint)indent,"",
                 (ulong)(uint)(int)*(char *)((long)data + 0x12),
                 (ulong)(uint)(int)*(char *)((long)data + 0x13));
      if (((byte)(*(char *)((long)data + 0x1f) - 1U) < 2) &&
         (la_vstring_append_sprintf
                    (vstr," Sublabel: %c%c",(ulong)(uint)(int)*(char *)((long)data + 0x14),
                     (ulong)(uint)(int)*(char *)((long)data + 0x15)),
         *(char *)((long)data + 0x1f) == '\x02')) {
        la_vstring_append_sprintf
                  (vstr," MFI: %c%c",(ulong)(uint)(int)*(char *)((long)data + 0x16),
                   (ulong)(uint)(int)*(char *)((long)data + 0x17));
      }
      la_vstring_append_sprintf(vstr,"%s","\n");
    }
  }
  else {
LAB_00155221:
    la_vstring_append_sprintf(vstr,"%*sNon-ACARS payload:\n",(ulong)(uint)indent,"");
    indent = indent + 1;
    la_vstring_append_sprintf
              (vstr,"%*sApplication ID: %s\n",(ulong)(uint)indent,"",(long)data + 0x12);
  }
  if (*data == (uint8_t *)0x0) goto LAB_0015534d;
  _Var2 = is_printable(*data,*(uint32_t *)((long)data + 0xc));
  if (!_Var2) {
    pcVar5 = la_hexdump(*data,(ulong)*(uint *)((long)data + 0xc));
    la_vstring_append_sprintf(vstr,"%*sMessage:\n",(ulong)(uint)indent,"");
    la_isprintf_multiline_text(vstr,indent + 1,pcVar5);
    free(pcVar5);
    goto LAB_0015534d;
  }
  uStack_28 = uStack_28 & 0xffffffffffffff;
  la_config_get_bool("prettify_xml",(_Bool *)((long)&uStack_28 + 7));
  if (uStack_28._7_1_ == '\x01') {
    pxVar4 = la_prettify_xml(*data);
    if (pxVar4 != (xmlBufferPtr)0x0) {
      la_vstring_append_sprintf(vstr,"%*sMessage (reformatted):\n",(ulong)(uint)indent,"");
      la_isprintf_multiline_text(vstr,indent + 1,(char *)pxVar4->content);
      xmlBufferFree(pxVar4);
      goto LAB_001552d9;
    }
    uStack_28 = uStack_28 & 0xffffffffffffff;
  }
  else {
LAB_001552d9:
    if (uStack_28._7_1_ != '\0') goto LAB_0015534d;
  }
  la_vstring_append_sprintf(vstr,"%*sMessage:\n",(ulong)(uint)indent,"");
  la_isprintf_multiline_text(vstr,indent + 1,*data);
LAB_0015534d:
  if (*(ushort *)((long)data + 10) != 0) {
    la_miam_errors_format_text(vstr,(uint)*(ushort *)((long)data + 10) << 0x10,indent + 1);
  }
  return;
}

Assistant:

static void la_miam_core_v2_data_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);
	la_assert(indent >= 0);

	static la_dict const v2_compression_names[] = {
		{ .id = LA_MIAM_CORE_V2_COMP_NONE,      .val = "none" },
		{ .id = LA_MIAM_CORE_V2_COMP_DEFLATE,   .val = "deflate" },
		{ .id = 0x0,                            .val = NULL }
	};

	static la_dict const v2_encoding_names[] = {
		{ .id = LA_MIAM_CORE_V2_ENC_ISO5,       .val = "ISO #5" },
		{ .id = LA_MIAM_CORE_V2_ENC_BINARY,     .val = "binary" },
		{ .id = 0x0,                            .val = NULL }
	};

	la_miam_core_v2_data_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	LA_ISPRINTF(vstr, indent, "Msg num: %u\n", pdu->msg_num);
	LA_ISPRINTF(vstr, indent, "ACK: %srequired\n",
			(pdu->ack_option == 1 ? "" : "not "));

	char *name = la_dict_search(v2_compression_names, pdu->compression);
	if(name != NULL) {
		LA_ISPRINTF(vstr, indent, "Compression: %s\n", name);
	} else {
		LA_ISPRINTF(vstr, indent, "Compression: unknown (%u)\n", pdu->compression);
	}

	name = la_dict_search(v2_encoding_names, pdu->encoding);
	if(name != NULL) {
		LA_ISPRINTF(vstr, indent, "Encoding: %s\n", name);
	} else {
		LA_ISPRINTF(vstr, indent, "Encoding: unknown (%u)\n", pdu->encoding);
	}

	switch(pdu->app_type) {
		case LA_MIAM_CORE_V2_APP_ACARS_2CHAR:
		case LA_MIAM_CORE_V2_APP_ACARS_4CHAR:
		case LA_MIAM_CORE_V2_APP_ACARS_6CHAR:
			LA_ISPRINTF(vstr, indent, "ACARS:\n");
			indent++;
			LA_ISPRINTF(vstr, indent, "Label: %c%c",
					pdu->app_id[0], pdu->app_id[1]);

			if(pdu->app_type == LA_MIAM_CORE_V2_APP_ACARS_4CHAR ||
					pdu->app_type == LA_MIAM_CORE_V2_APP_ACARS_6CHAR) {
				la_vstring_append_sprintf(vstr, " Sublabel: %c%c",
						pdu->app_id[2], pdu->app_id[3]);
			}

			if(pdu->app_type == LA_MIAM_CORE_V2_APP_ACARS_6CHAR) {
				la_vstring_append_sprintf(vstr, " MFI: %c%c",
						pdu->app_id[4], pdu->app_id[5]);
			}

			la_vstring_append_sprintf(vstr, "%s", "\n");
			break;
		case 0x4:
		case 0x5:
		case 0x6:
		case 0x7:
		case 0xd:
			// reserved for future use
			break;
		case LA_MIAM_CORE_V2_APP_NONACARS_6CHAR:
		default:    // including 0x8-0x15
			LA_ISPRINTF(vstr, indent, "Non-ACARS payload:\n");
			indent++;
			LA_ISPRINTF(vstr, indent, "Application ID: %s\n", pdu->app_id);
			break;
	}

	if(pdu->data != NULL) {
		// Don't trust pdu->encoding - if the payload is printable, then print it as text.
		// Otherwise print a hexdump.
		if(is_printable(pdu->data, pdu->data_len)) {
			// Parser has appended '\0' at the end, so it's safe to print it directly
			bool prettify_xml = false;
#ifdef WITH_LIBXML2
			(void)la_config_get_bool("prettify_xml", &prettify_xml);
			if(prettify_xml == true) {
				xmlBufferPtr xmlbufptr = NULL;
				if((xmlbufptr = la_prettify_xml((char *)pdu->data)) != NULL) {
					LA_ISPRINTF(vstr, indent, "Message (reformatted):\n");
					la_isprintf_multiline_text(vstr, indent + 1, (char *)xmlbufptr->content);
					xmlBufferFree(xmlbufptr);
				} else {
					// Doesn't look like XML - print it as normal
					prettify_xml = false;
				}
			}
#endif
			if(prettify_xml == false) {
				LA_ISPRINTF(vstr, indent, "Message:\n");
				la_isprintf_multiline_text(vstr, indent + 1, (char *)pdu->data);
			}
		} else {
			char *hexdump = la_hexdump((uint8_t *)pdu->data, pdu->data_len);
			LA_ISPRINTF(vstr, indent, "Message:\n");
			la_isprintf_multiline_text(vstr, indent + 1, hexdump);
			LA_XFREE(hexdump);
		}
	}

	if(pdu->err & LA_MIAM_ERR_BODY) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_BODY, indent + 1);
		return;
	}
}